

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned__int128,float>>,Gudhi::ripser::TParams<true,unsigned__int128,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  long lVar1;
  long lVar2;
  undefined1 idx_00 [16];
  uint uVar3;
  simplex_t *psVar4;
  undefined4 in_register_00000014;
  long extraout_RDX;
  undefined8 unaff_RBX;
  char cVar5;
  undefined7 in_register_00000031;
  char in_R8B;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *this_00;
  simplex_t *psVar6;
  bool bVar7;
  
  psVar6 = (simplex_t *)CONCAT44(in_register_00000014,n);
  this_00 = (Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
            (CONCAT71(in_register_00000031,dim) + 0x30);
  for (cVar5 = in_R8B + '\x01'; '\x01' < cVar5; cVar5 = cVar5 + -1) {
    idx_00._8_8_ = unaff_RBX;
    idx_00._0_8_ = this;
    uVar3 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
            get_max_vertex(this_00,(simplex_t)idx_00,(dimension_t)psVar6,(vertex_t)out);
    lVar2 = *(long *)idx;
    lVar1 = lVar2 + -4;
    *(long *)idx = lVar1;
    *(uint *)(lVar2 + -4) = uVar3;
    psVar4 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                       ((simplex_t *)this_00,
                        (Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                         *)(ulong)uVar3,(int)cVar5,(dimension_t)lVar1);
    bVar7 = psVar6 < psVar4;
    psVar6 = (simplex_t *)((long)psVar6 - (long)psVar4);
    out = (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *)((long)out + (-(ulong)bVar7 - extraout_RDX));
  }
  lVar1 = *(long *)idx;
  *(int *)(lVar1 + -4) = (int)psVar6;
  *(long *)this = lVar1;
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }